

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

bool __thiscall
crnlib::dynamic_string::expand_buf(dynamic_string *this,uint new_buf_size,bool preserve_contents)

{
  uint32 uVar1;
  uint uVar2;
  char *__dest;
  char *__src;
  uint uVar3;
  char *p;
  
  uVar3 = (uint)this->m_buf_size;
  if (this->m_buf_size <= new_buf_size) {
    uVar3 = new_buf_size;
  }
  uVar1 = math::next_pow2(uVar3);
  uVar3 = 0xffff;
  if (uVar1 < 0xffff) {
    uVar3 = uVar1;
  }
  uVar2 = (uint)this->m_buf_size;
  if (uVar3 != this->m_buf_size) {
    __dest = crnlib_new_array<char>(uVar3);
    p = this->m_pStr;
    if (preserve_contents) {
      __src = "";
      if (p != (char *)0x0) {
        __src = p;
      }
      memcpy(__dest,__src,(ulong)this->m_len + 1);
      p = this->m_pStr;
    }
    crnlib_delete_array<char>(p);
    this->m_pStr = __dest;
    this->m_buf_size = (uint16)uVar3;
    uVar2 = uVar3;
  }
  return uVar3 <= (uVar2 & 0xffff);
}

Assistant:

bool dynamic_string::expand_buf(uint new_buf_size, bool preserve_contents)
    {
        new_buf_size = math::minimum<uint>(cUINT16_MAX, math::next_pow2(math::maximum<uint>(m_buf_size, new_buf_size)));

        if (new_buf_size != m_buf_size)
        {
            char* p = crnlib_new_array<char>(new_buf_size);

            if (preserve_contents)
            {
                memcpy(p, get_ptr_priv(), m_len + 1);
            }

            crnlib_delete_array(m_pStr);
            m_pStr = p;

            m_buf_size = static_cast<uint16>(new_buf_size);

            if (preserve_contents)
            {
                check();
            }
        }

        return m_buf_size >= new_buf_size;
    }